

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

void __thiscall Centaurus::GrammarOptions::parse(GrammarOptions *this,Stream *stream)

{
  wchar_t wVar1;
  StreamException *pSVar2;
  Identifier value;
  Identifier key;
  
  wVar1 = Stream::skip_whitespace(stream);
  if (wVar1 != L'{') {
    pSVar2 = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(pSVar2,stream,wVar1);
    __cxa_throw(pSVar2,&StreamException::typeinfo,StreamException::~StreamException);
  }
  Stream::get(stream);
  while( true ) {
    Identifier::Identifier(&key,stream);
    wVar1 = Stream::skip_whitespace(stream);
    if (wVar1 != L'=') {
      pSVar2 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar2,stream,wVar1);
      __cxa_throw(pSVar2,&StreamException::typeinfo,StreamException::~StreamException);
    }
    Stream::get(stream);
    Identifier::Identifier(&value,stream);
    wVar1 = Stream::skip_whitespace(stream);
    if (wVar1 != L';') break;
    Stream::get(stream);
    std::
    _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,std::__cxx11::wstring>,std::allocator<std::pair<Centaurus::Identifier_const,std::__cxx11::wstring>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<Centaurus::Identifier&,std::__cxx11::wstring_const&>
              ((_Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,std::__cxx11::wstring>,std::allocator<std::pair<Centaurus::Identifier_const,std::__cxx11::wstring>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->
                   super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
               ,&key,&value.m_id);
    Identifier::~Identifier(&value);
    Identifier::~Identifier(&key);
  }
  pSVar2 = (StreamException *)__cxa_allocate_exception(0x28);
  Stream::unexpected(pSVar2,stream,wVar1);
  __cxa_throw(pSVar2,&StreamException::typeinfo,StreamException::~StreamException);
}

Assistant:

void GrammarOptions::parse(Stream& stream)
{
    wchar_t ch = stream.skip_whitespace();
    if (ch != L'{')
        throw stream.unexpected(ch);
    stream.discard();

    while (true)
    {
        Identifier key(stream);

        ch = stream.skip_whitespace();
        if (ch != L'=')
            throw stream.unexpected(ch);
        stream.discard();

        Identifier value(stream);

        ch = stream.skip_whitespace();
        if (ch != L';')
            throw stream.unexpected(ch);
        stream.discard();

        emplace(key, value.str());
    }

    ch = stream.skip_whitespace();
    if (ch != L'}')
        throw stream.unexpected(ch);
    stream.discard();
}